

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_port_resp(connectdata *conn,int ftpcode)

{
  int iVar1;
  Curl_easy *data_00;
  ftpport fcmd_00;
  ulong uVar2;
  CURLcode local_30;
  CURLcode result;
  ftpport fcmd;
  ftp_conn *ftpc;
  Curl_easy *data;
  int ftpcode_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  iVar1 = (conn->proto).ftpc.count1;
  uVar2 = (long)ftpcode % 100 & 0xffffffff;
  if (ftpcode / 100 == 2) {
    Curl_infof(data_00,"Connect data stream actively\n",uVar2);
    _state(conn,FTP_STOP);
    local_30 = ftp_dophase_done(conn,false);
  }
  else {
    if (iVar1 == 0) {
      Curl_infof(data_00,"disabling EPRT usage\n",uVar2);
      (conn->bits).ftp_use_eprt = false;
    }
    fcmd_00 = iVar1 + PORT;
    if (fcmd_00 == DONE) {
      Curl_failf(data_00,"Failed to do PORT");
      local_30 = CURLE_FTP_PORT_FAILED;
    }
    else {
      local_30 = ftp_state_use_port(conn,fcmd_00);
    }
  }
  return local_30;
}

Assistant:

static CURLcode ftp_state_port_resp(struct connectdata *conn,
                                    int ftpcode)
{
  struct Curl_easy *data = conn->data;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  ftpport fcmd = (ftpport)ftpc->count1;
  CURLcode result = CURLE_OK;

  /* The FTP spec tells a positive response should have code 200.
     Be more permissive here to tolerate deviant servers. */
  if(ftpcode / 100 != 2) {
    /* the command failed */

    if(EPRT == fcmd) {
      infof(data, "disabling EPRT usage\n");
      conn->bits.ftp_use_eprt = FALSE;
    }
    fcmd++;

    if(fcmd == DONE) {
      failf(data, "Failed to do PORT");
      result = CURLE_FTP_PORT_FAILED;
    }
    else
      /* try next */
      result = ftp_state_use_port(conn, fcmd);
  }
  else {
    infof(data, "Connect data stream actively\n");
    state(conn, FTP_STOP); /* end of DO phase */
    result = ftp_dophase_done(conn, FALSE);
  }

  return result;
}